

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O0

_Bool project_o(source origin,wchar_t r,loc_conflict grid,wchar_t dam,wchar_t typ,
               object *protected_obj)

{
  char o_name [80];
  project_object_handler_context_t context;
  project_object_handler_f object_handler;
  object *next;
  char *note_kill;
  _Bool do_kill;
  _Bool ignore;
  object *poStack_38;
  _Bool obvious;
  object *obj;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t r_local;
  loc_conflict grid_local;
  source origin_local;
  
  poStack_38 = square_object((chunk *)cave,grid);
  while (poStack_38 != (object *)0x0) {
    poStack_38 = poStack_38->next;
    o_name._76_4_ = grid_local.y;
    o_name._72_4_ = origin.what;
    if (object_handlers[typ] != (project_object_handler_f)0x0) {
      (*object_handlers[typ])((project_object_handler_context_t *)(o_name + 0x48));
    }
  }
  return false;
}

Assistant:

bool project_o(struct source origin, int r, struct loc grid, int dam, int typ,
			   const struct object *protected_obj)
{
	struct object *obj = square_object(cave, grid);
	bool obvious = false;

	/* Scan all objects in the grid */
	while (obj) {
		bool ignore = false;
		bool do_kill = false;
		const char *note_kill = NULL;
		struct object *next = obj->next;

		project_object_handler_f object_handler = object_handlers[typ];
		project_object_handler_context_t context = {
			origin,
			r,
			grid,
			dam,
			typ,
			obj,
			obvious,
			do_kill,
			ignore,
			note_kill,
		};

		if (object_handler != NULL)
			object_handler(&context);

		obvious = context.obvious;
		do_kill = context.do_kill && (obj != protected_obj);
		ignore = context.ignore;
		note_kill = context.note_kill;

		/* Attempt to destroy the object */
		if (do_kill) {
			char o_name[80];

			/* Effect observed */
			if (obj->known && !ignore_item_ok(player, obj) &&
				square_isseen(cave, grid)) {
				obvious = true;
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_BASE, player);
			}

			/* Artifacts, and other objects, get to resist */
			if (obj->artifact || ignore) {
				/* Observe the resist */
				if (obvious && obj->known
						&& !ignore_item_ok(player, obj)) {
					msg("The %s %s unaffected!", o_name,
						VERB_AGREEMENT(obj->number, "is", "are"));
				}
			} else if (obj->mimicking_m_idx) {
				/* Reveal mimics */
				if (obvious)
					become_aware(cave, cave_monster(
						cave, obj->mimicking_m_idx));
			} else {
				/* Describe if needed */
				if (obvious && obj->known && note_kill
						&& !ignore_item_ok(player, obj)) {
					msgt(MSG_DESTROY, "The %s %s!", o_name, note_kill);
				}

				/* Prevent command repetition, if necessary. */
				if (loc_eq(grid, player->grid)) {
					cmd_disable_repeat_floor_item();
				}

				/* Delete the object */
				square_delete_object(cave, grid, obj, true, true);
			}
		}

		/* Next object */
		obj = next;
	}

	/* Return "Anything seen?" */
	return (obvious);
}